

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayEqualFailsOnException::RunImpl
          (TestCheckArrayEqualFailsOnException *this)

{
  TestResults *pTVar1;
  bool bVar2;
  int iVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  TestDetails local_900 [2];
  TestDetails local_8c0;
  ThrowingObject local_899;
  float fStack_898;
  float fStack_894;
  ThrowingObject obj;
  float data [4];
  undefined1 local_880 [8];
  ScopedCurrentTest scopedResults;
  undefined1 local_860 [8];
  TestResults testResults;
  RecordingReporter reporter;
  bool failure;
  TestCheckArrayEqualFailsOnException *this_local;
  
  RecordingReporter::RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)local_860,(TestReporter *)&testResults.m_failureCount);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)local_880,(TestResults *)local_860,(TestDetails *)0x0);
  fStack_898 = 0.0;
  fStack_894 = 1.0;
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8c0,*ppTVar5,0x22e);
  UnitTest::CheckArrayEqual<float[4],(anonymous_namespace)::ThrowingObject>
            (pTVar1,(float (*) [4])&fStack_898,&local_899,3,&local_8c0);
  iVar3 = UnitTest::TestResults::GetFailureCount((TestResults *)local_860);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)local_880);
  RecordingReporter::~RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  bVar2 = UnitTest::Check<bool>(0 < iVar3);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_900,*ppTVar5,0x233);
    UnitTest::TestResults::OnTestFailure(pTVar1,local_900,"failure");
  }
  return;
}

Assistant:

TEST(CheckArrayEqualFailsOnException)
{
    bool failure = false;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		const float data[4] = { 0, 1, 2, 3 };
        ThrowingObject obj;
        CHECK_ARRAY_EQUAL (data, obj, 3);

		failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(failure);
}